

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedInteger
          (ParserImpl *this,uint64 *value,uint64 max_value)

{
  bool bVar1;
  Token *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint64 local_28;
  uint64 max_value_local;
  uint64 *value_local;
  ParserImpl *this_local;
  
  local_28 = max_value;
  max_value_local = (uint64)value;
  value_local = (uint64 *)this;
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    bVar1 = io::Tokenizer::ParseInteger(&pTVar2->text,local_28,(uint64 *)max_value_local);
    if (bVar1) {
      io::Tokenizer::Next(&this->tokenizer_);
      this_local._7_1_ = true;
    }
    else {
      pTVar2 = io::Tokenizer::current(&this->tokenizer_);
      std::operator+(&local_98,"Integer out of range (",&pTVar2->text);
      std::operator+(&local_78,&local_98,")");
      ReportError(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    std::operator+(&local_48,"Expected integer, got: ",&pTVar2->text);
    ReportError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConsumeUnsignedInteger(uint64* value, uint64 max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError("Expected integer, got: " + tokenizer_.current().text);
      return false;
    }

    if (!io::Tokenizer::ParseInteger(tokenizer_.current().text,
                                     max_value, value)) {
      ReportError("Integer out of range (" + tokenizer_.current().text + ")");
      return false;
    }

    tokenizer_.Next();
    return true;
  }